

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListFile.cpp
# Opt level: O0

size_t ListFile_GetNextLine(void *pvListFile,char **pszLineBegin,char **pszLineEnd)

{
  char *pcVar1;
  bool bVar2;
  char *local_50;
  char *szLineEnd;
  char *szLineBegin;
  char *szExtraString;
  PLISTFILE_CACHE pCache;
  char **pszLineEnd_local;
  char **pszLineBegin_local;
  void *pvListFile_local;
  
  szLineBegin = (char *)0x0;
  while( true ) {
    bVar2 = false;
    if (*(ulong *)((long)pvListFile + 8) < *(ulong *)((long)pvListFile + 0x10)) {
      bVar2 = **(char **)((long)pvListFile + 8) < '!';
    }
    if (!bVar2) break;
    *(long *)((long)pvListFile + 8) = *(long *)((long)pvListFile + 8) + 1;
  }
  pcVar1 = *(char **)((long)pvListFile + 8);
  while ((((*(ulong *)((long)pvListFile + 8) < *(ulong *)((long)pvListFile + 0x10) &&
           (**(char **)((long)pvListFile + 8) != '\n')) &&
          (**(char **)((long)pvListFile + 8) != '\r')) &&
         (**(char **)((long)pvListFile + 8) != 0x85))) {
    if (**(char **)((long)pvListFile + 8) == '~') {
      szLineBegin = *(char **)((long)pvListFile + 8);
    }
    *(long *)((long)pvListFile + 8) = *(long *)((long)pvListFile + 8) + 1;
  }
  if (((szLineBegin == (char *)0x0) || (*szLineBegin != '~')) || (szLineBegin[1] != 'P')) {
    local_50 = *(char **)((long)pvListFile + 8);
  }
  else {
    local_50 = szLineBegin;
  }
  *pszLineBegin = pcVar1;
  *pszLineEnd = local_50;
  return (long)local_50 - (long)pcVar1;
}

Assistant:

size_t ListFile_GetNextLine(void * pvListFile, const char ** pszLineBegin, const char ** pszLineEnd)
{
    PLISTFILE_CACHE pCache = (PLISTFILE_CACHE)pvListFile;
    char * szExtraString = NULL;
    char * szLineBegin;
    char * szLineEnd;

    // Skip newlines, spaces, tabs and another non-printable stuff
    while(pCache->pPos < pCache->pEnd && pCache->pPos[0] <= 0x20)
        pCache->pPos++;

    // Remember the begin of the line
    szLineBegin = pCache->pPos;

    // Copy the remaining characters
    while(pCache->pPos < pCache->pEnd)
    {
        // If we have found a newline, stop loading
        // Note: the 0x85 char came from Overwatch build 24919
        if(pCache->pPos[0] == 0x0A || pCache->pPos[0] == 0x0D || pCache->pPos[0] == 0x85)
            break;

        // Blizzard listfiles can also contain information about patch:
        // Pass1\Files\MacOS\unconditional\user\Background Downloader.app\Contents\Info.plist~Patch(Data#frFR#base-frFR,1326)
        if(pCache->pPos[0] == '~')
            szExtraString = pCache->pPos;

        // Move the position by one character forward
        pCache->pPos++;
    }

    // Remember the end of the line
    szLineEnd = (szExtraString != NULL && szExtraString[0] == '~' && szExtraString[1] == 'P') ? szExtraString : pCache->pPos;

    // Give the caller the positions of the begin and end of the line
    pszLineBegin[0] = szLineBegin;
    pszLineEnd[0] = szLineEnd;
    return (size_t)(szLineEnd - szLineBegin);
}